

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O1

void __thiscall HACD::MyMicroAllocator::removeMicroChunk(MyMicroAllocator *this)

{
  MemoryChunk *in_RSI;
  
  removeMicroChunk((MyMicroAllocator *)&this[-1].mAlloc[5].mChunks.mChunks[0x1f].mChunkSize,in_RSI);
  return;
}

Assistant:

virtual void removeMicroChunk(MemoryChunk *chunk)
  {
    mLastMicroChunk = 0;
    #ifdef _DEBUG
    bool removed = false;
    #endif
    for (NxU32 i=0; i<mMicroChunkCount; i++)
    {
        if ( mMicroChunks[i].mChunk == chunk )
        {
            mMicroChunkCount--;
            for (NxU32 j=i; j<mMicroChunkCount; j++)
            {
                mMicroChunks[j] = mMicroChunks[j+1];
            }
            #ifdef _DEBUG
            removed = true;
            #endif
            break;
        }
    }
#ifdef _DEBUG
    assert(removed);
#endif
  }